

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::start_raytracing(PathTracer *this)

{
  size_t sVar1;
  size_t sVar2;
  pointer pLVar3;
  thread *this_00;
  size_t x;
  ulong uVar4;
  size_t y;
  ulong uVar5;
  code *local_48;
  undefined8 local_40;
  PathTracer *local_38;
  
  if (this->state == READY) {
    pLVar3 = (this->rayLog).
             super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>.
        _M_impl.super__Vector_impl_data._M_finish != pLVar3) {
      (this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>.
      _M_impl.super__Vector_impl_data._M_finish = pLVar3;
    }
    WorkQueue<CMU462::WorkItem>::clear(&this->workQueue);
    this->state = RENDERING;
    this->continueRaytracing = true;
    uVar5 = 0;
    LOCK();
    (this->workerDoneCount).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    HDRImageBuffer::clear(&this->sampleBuffer);
    ImageBuffer::clear(&this->frameBuffer);
    uVar4 = (this->sampleBuffer).h;
    sVar1 = (this->sampleBuffer).w / this->imageTileSize + 1;
    this->num_tiles_w = sVar1;
    sVar2 = uVar4 / this->imageTileSize + 1;
    this->num_tiles_h = sVar2;
    std::vector<int,_std::allocator<int>_>::resize(&this->tile_samples,sVar2 * sVar1);
    memset((this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,0,this->num_tiles_w * this->num_tiles_h * 4);
    for (; uVar5 < (this->sampleBuffer).h; uVar5 = uVar5 + this->imageTileSize) {
      for (uVar4 = 0; uVar4 < (this->sampleBuffer).w; uVar4 = uVar4 + this->imageTileSize) {
        local_40._4_4_ = (int)this->imageTileSize;
        local_48 = (code *)CONCAT44((int)uVar5,(int)uVar4);
        local_40._0_4_ = local_40._4_4_;
        WorkQueue<CMU462::WorkItem>::put_work(&this->workQueue,(WorkItem *)&local_48);
      }
    }
    fwrite("[PathTracer] Rendering... ",0x1a,1,_stdout);
    fflush(_stdout);
    for (uVar4 = 0; uVar4 < this->numWorkerThreads; uVar4 = uVar4 + 1) {
      this_00 = (thread *)operator_new(8);
      local_48 = worker_thread;
      local_40._0_4_ = 0;
      local_40._4_4_ = 0;
      local_38 = this;
      std::thread::thread<void(CMU462::PathTracer::*)(),CMU462::PathTracer*,void>
                (this_00,(type *)&local_48,&local_38);
      (this->workerThreads).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar4] = this_00;
    }
  }
  return;
}

Assistant:

void PathTracer::start_raytracing() {
    if (state != READY) return;

    rayLog.clear();
    workQueue.clear();

    state = RENDERING;
    continueRaytracing = true;
    workerDoneCount = 0;

    sampleBuffer.clear();
    frameBuffer.clear();
    num_tiles_w = sampleBuffer.w / imageTileSize + 1;
    num_tiles_h = sampleBuffer.h / imageTileSize + 1;
    tile_samples.resize(num_tiles_w * num_tiles_h);
    memset(&tile_samples[0], 0, num_tiles_w * num_tiles_h * sizeof(int));

    // populate the tile work queue
    for (size_t y = 0; y < sampleBuffer.h; y += imageTileSize) {
      for (size_t x = 0; x < sampleBuffer.w; x += imageTileSize) {
        workQueue.put_work(WorkItem(x, y, imageTileSize, imageTileSize));
      }
    }

    // launch threads
    fprintf(stdout, "[PathTracer] Rendering... "); fflush(stdout);
    for (int i=0; i<numWorkerThreads; i++) {
      workerThreads[i] = new std::thread(&PathTracer::worker_thread, this);
    }
  }